

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManDecideHighest(Cbs2_Man_t *p)

{
  bool bVar1;
  int local_1c;
  int local_18;
  int iObjMax;
  int iObj;
  int i;
  Cbs2_Man_t *p_local;
  
  local_1c = 0;
  iObjMax = (p->pJust).iHead;
  while( true ) {
    bVar1 = false;
    if (iObjMax < (p->pJust).iTail) {
      local_18 = (p->pJust).pData[iObjMax];
      bVar1 = local_18 != 0;
    }
    if (!bVar1) break;
    if ((local_1c == 0) || (local_1c < local_18)) {
      local_1c = local_18;
    }
    iObjMax = iObjMax + 1;
  }
  return local_1c;
}

Assistant:

static inline int Cbs2_ManDecideHighest( Cbs2_Man_t * p )
{
    int i, iObj, iObjMax = 0;
    Cbs2_QueForEachEntry( p->pJust, iObj, i )
        if ( iObjMax == 0 || iObjMax < iObj )
            iObjMax = iObj;
    return iObjMax;
}